

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderTestparseWithNoErrors::~TestCharReaderTestparseWithNoErrors
          (TestCharReaderTestparseWithNoErrors *this)

{
  void *in_RDI;
  
  ~TestCharReaderTestparseWithNoErrors((TestCharReaderTestparseWithNoErrors *)0x16abf8);
  operator_delete(in_RDI);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithNoErrors) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] = "{ \"property\" : \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs.size() == 0);
  delete reader;
}